

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  StreamReplacer *this;
  undefined8 extraout_RAX;
  long *plVar3;
  ostream *poVar4;
  char *pcVar5;
  int extraout_EDX;
  long lVar6;
  char *pcVar7;
  char *__s1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  bool bVar9;
  QPDF qpdf;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8 [3];
  ulong local_90;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  pcVar5 = (char *)0x0;
  local_90 = 0;
  pcVar7 = (char *)0x0;
  for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
    __s1 = argv[lVar6];
    iVar2 = strcmp(__s1,"--decode-specialized");
    if (iVar2 == 0) {
      local_90 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
      __s1 = pcVar7;
    }
    else if ((pcVar7 != (char *)0x0) &&
            (bVar9 = pcVar5 != (char *)0x0, pcVar5 = __s1, __s1 = pcVar7, bVar9)) goto LAB_0010530a;
    pcVar7 = __s1;
  }
  if ((pcVar7 != (char *)0x0) && (pcVar5 != (char *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"/XORDecode",(allocator<char> *)&p);
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<std::shared_ptr<QPDFStreamFilter>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/examples/pdf-custom-filter.cc:403:50)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<std::shared_ptr<QPDFStreamFilter>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/examples/pdf-custom-filter.cc:403:50)>
               ::_M_manager;
    QPDF::registerStreamFilter(&local_b0);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::__cxx11::string::~string((string *)&local_b0);
    QPDF::QPDF(&qpdf);
    QPDF::processFile((char *)&qpdf,pcVar7);
    this = (StreamReplacer *)operator_new(0x78);
    StreamReplacer::StreamReplacer(this,&qpdf);
    std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<StreamReplacer,void>
              ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,(__gnu_cxx::_Lock_policy)2> *)&p,
               this);
    QPDF::getAllObjects();
    for (p_Var8 = local_b0; p_Var8 != local_a8[0]._M_pi; p_Var8 = p_Var8 + 1) {
      cVar1 = QPDFObjectHandle::isStream();
      if (cVar1 != '\0') {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)p_Var8);
        std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_78,
                     &p.
                      super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                    );
        StreamReplacer::registerStream
                  (this,(QPDFObjectHandle *)&local_68,
                   (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      }
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_b0);
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_b0,&qpdf,pcVar5);
    if ((local_90 & 1) != 0) {
      QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)&local_b0);
    }
    QPDFWriter::setStaticID(SUB81(&local_b0,0));
    QPDFWriter::write();
    poVar4 = std::operator<<((ostream *)&std::cout,whoami);
    poVar4 = std::operator<<(poVar4,": new file written to ");
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.
                super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDF::~QPDF(&qpdf);
    return 0;
  }
LAB_0010530a:
  usage();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QPDF::~QPDF(&qpdf);
  if (extraout_EDX != 1) {
    _Unwind_Resume(extraout_RAX);
  }
  plVar3 = (long *)__cxa_begin_catch(extraout_RAX);
  poVar4 = std::operator<<((ostream *)&std::cerr,whoami);
  poVar4 = std::operator<<(poVar4,": exception: ");
  pcVar5 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    char const* infilename = nullptr;
    char const* outfilename = nullptr;
    bool decode_specialized = false;
    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "--decode-specialized") == 0) {
            decode_specialized = true;
        } else if (!infilename) {
            infilename = argv[i];
        } else if (!outfilename) {
            outfilename = argv[i];
        } else {
            usage();
        }
    }
    if (!(infilename && outfilename)) {
        usage();
    }

    try {
        // Register our fictitious filter. This enables QPDFWriter to decode our streams. This is
        // not a real filter, so no real PDF reading application would be able to interpret it. This
        // is just for illustrative purposes.
        QPDF::registerStreamFilter("/XORDecode", [] { return std::make_shared<SF_XORDecode>(); });
        // Do the actual processing.
        process(infilename, outfilename, decode_specialized);
    } catch (std::exception& e) {
        std::cerr << whoami << ": exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}